

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_fwd.hpp
# Opt level: O0

region * __thiscall toml::detail::syntax::key::scan(key *this,location *loc)

{
  region *in_RDI;
  
  either::scan((either *)this,loc);
  return in_RDI;
}

Assistant:

region scan(location& loc) const override
    {
        return scanner_.scan(loc);
    }